

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS
ref_import_bin_ugrid_c2n(REF_CELL ref_cell,REF_INT ncell,FILE *file,REF_BOOL swap,REF_BOOL fat)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  REF_INT *chunk;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  REF_INT *pRVar12;
  REF_INT new_cell;
  REF_INT nodes [27];
  int local_d4;
  long local_d0;
  ulong local_c8;
  FILE *local_c0;
  long local_b8;
  REF_CELL local_b0;
  REF_INT local_a8 [30];
  
  if (0 < ncell) {
    uVar1 = ref_cell->node_per;
    if ((int)uVar1 < ref_cell->size_per) {
      local_a8[(int)uVar1] = -1;
    }
    uVar5 = 1000000;
    if ((uint)ncell < 1000000) {
      uVar5 = ncell;
    }
    if ((int)(uVar1 * uVar5) < 0) {
      pcVar10 = "malloc c2n of REF_INT negative";
      uVar7 = 499;
LAB_0015ffad:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar7,"ref_import_bin_ugrid_c2n",pcVar10);
      return 1;
    }
    chunk = (REF_INT *)malloc((ulong)(uVar1 * uVar5) << 2);
    if (chunk == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",499,
             "ref_import_bin_ugrid_c2n","malloc c2n of REF_INT NULL");
      return 2;
    }
    local_b8 = (ulong)uVar1 * 4;
    uVar11 = 0;
    local_d0 = (long)(int)uVar1;
    local_c0 = file;
    local_b0 = ref_cell;
    do {
      uVar8 = ncell - (int)uVar11;
      uVar2 = uVar8;
      if ((int)uVar5 < (int)uVar8) {
        uVar2 = uVar5;
      }
      local_c8 = uVar11;
      uVar3 = ref_import_bin_ugrid_chunk(local_c0,swap,fat,uVar2 * (int)local_d0,chunk);
      if (uVar3 != 0) {
        pcVar10 = "c2n";
        uVar7 = 0x1f8;
LAB_0015ff80:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar7,"ref_import_bin_ugrid_c2n",(ulong)uVar3,pcVar10);
        return uVar3;
      }
      iVar6 = (int)local_c8;
      if (0 < (int)uVar8) {
        uVar11 = 1;
        if (1 < (int)uVar2) {
          uVar11 = (ulong)uVar2;
        }
        uVar9 = 0;
        pRVar12 = chunk;
        do {
          if (0 < (int)local_d0) {
            uVar4 = 0;
            do {
              local_a8[uVar4] = pRVar12[uVar4] + -1;
              uVar4 = uVar4 + 1;
            } while (uVar1 != uVar4);
          }
          uVar3 = ref_cell_add(local_b0,local_a8,&local_d4);
          if (uVar3 != 0) {
            pcVar10 = "new cell";
            uVar7 = 0x1fd;
            goto LAB_0015ff80;
          }
          iVar6 = (int)local_c8;
          if (iVar6 + (int)uVar9 != local_d4) {
            pcVar10 = "cell index";
            uVar7 = 0x1fe;
            goto LAB_0015ffad;
          }
          uVar9 = uVar9 + 1;
          pRVar12 = (REF_INT *)((long)pRVar12 + local_b8);
        } while (uVar9 != uVar11);
      }
      uVar11 = (ulong)(uVar2 + iVar6);
    } while ((int)(uVar2 + iVar6) < ncell);
    free(chunk);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid_c2n(REF_CELL ref_cell,
                                                   REF_INT ncell, FILE *file,
                                                   REF_BOOL swap,
                                                   REF_BOOL fat) {
  REF_INT node_per, max_chunk, nread, chunk, cell, node, new_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *c2n;

  if (0 < ncell) {
    /* to skip boundary tag */
    if (ref_cell_size_per(ref_cell) > ref_cell_node_per(ref_cell))
      nodes[ref_cell_node_per(ref_cell)] = REF_EMPTY;
    node_per = ref_cell_node_per(ref_cell);
    max_chunk = MIN(1000000, ncell);
    ref_malloc(c2n, node_per * max_chunk, REF_INT);
    nread = 0;
    while (nread < ncell) {
      chunk = MIN(max_chunk, ncell - nread);
      RSS(ref_import_bin_ugrid_chunk(file, swap, fat, node_per * chunk, c2n),
          "c2n");
      for (cell = 0; cell < chunk; cell++) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = c2n[node + node_per * cell] - 1;
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new cell");
        RES(cell + nread, new_cell, "cell index");
      }
      nread += chunk;
    }
    ref_free(c2n);
  }

  return REF_SUCCESS;
}